

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void on_upgrade_complete(void *_conn,h2o_socket_t *sock,size_t reqsize)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  byte bVar5;
  h2o_http2_stream_t *stream;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t min_guarantee;
  h2o_buffer_t **_inbuf;
  long *in_FS_OFFSET;
  
  if (sock == (h2o_socket_t *)0x0) {
    *(undefined4 *)((long)_conn + 0xa8) = 2;
    if ((*(long *)((long)_conn + 0x188) == 0) && (*(long *)((long)_conn + 0x1b0) == 0)) {
      close_connection_now((h2o_http2_conn_t *)_conn);
      return;
    }
  }
  else {
    *(h2o_socket_t **)((long)_conn + 0x30) = sock;
    sock->data = _conn;
    *(h2o_buffer_t **)((long)_conn + 200) = sock->input;
    sock->input = (h2o_buffer_t *)(*in_FS_OFFSET + 0x18);
    h2o_socket_read_start(*(h2o_socket_t **)((long)_conn + 0x30),on_read);
    puVar3 = *(uint **)((long)_conn + 0x50);
    uVar1 = *puVar3;
    if (uVar1 == 0) {
      uVar6 = 0;
LAB_0014db77:
      if (uVar6 == uVar1) {
        stream = (h2o_http2_stream_t *)0x0;
      }
      else {
        stream = *(h2o_http2_stream_t **)(*(long *)(puVar3 + 8) + (ulong)uVar6 * 8);
      }
    }
    else {
      uVar7 = uVar1 - 1 & 0x801;
      iVar8 = 1;
      stream = (h2o_http2_stream_t *)0x0;
      uVar6 = uVar7;
      do {
        uVar2 = *(uint *)(*(long *)(puVar3 + 4) + (ulong)(uVar6 >> 4) * 4);
        bVar5 = (char)uVar6 * '\x02' & 0x1e;
        uVar9 = uVar2 >> bVar5;
        if (((uVar9 & 2) != 0) ||
           (((uVar9 & 1) == 0 && (*(long *)(*(long *)(puVar3 + 6) + (ulong)uVar6 * 8) == 1)))) {
          if ((uVar2 >> bVar5 & 3) != 0) {
            uVar6 = uVar1;
          }
          goto LAB_0014db77;
        }
        uVar6 = uVar6 + iVar8 & uVar1 - 1;
        iVar8 = iVar8 + 1;
      } while (uVar6 != uVar7);
    }
    execute_or_enqueue_request((h2o_http2_conn_t *)_conn,stream);
    uVar4 = *(ulong *)(*(long *)((long)_conn + 200) + 8);
    min_guarantee = uVar4 - reqsize;
    if (reqsize <= uVar4 && min_guarantee != 0) {
      _inbuf = &sock->input;
      h2o_buffer_reserve(_inbuf,min_guarantee);
      memcpy((*_inbuf)->bytes,(void *)(reqsize + *(long *)(*(long *)((long)_conn + 200) + 0x10)),
             min_guarantee);
      (*_inbuf)->size = (*_inbuf)->size + min_guarantee;
      on_read(*(h2o_socket_t **)((long)_conn + 0x30),(char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

static void on_upgrade_complete(void *_conn, h2o_socket_t *sock, size_t reqsize)
{
    h2o_http2_conn_t *conn = _conn;

    if (sock == NULL) {
        close_connection(conn);
        return;
    }

    conn->sock = sock;
    sock->data = conn;
    conn->_http1_req_input = sock->input;
    h2o_buffer_init(&sock->input, &h2o_socket_buffer_prototype);

    /* setup inbound */
    h2o_socket_read_start(conn->sock, on_read);

    /* handle the request */
    execute_or_enqueue_request(conn, h2o_http2_conn_get_stream(conn, 1));

    if (conn->_http1_req_input->size > reqsize) {
        size_t remaining_bytes = conn->_http1_req_input->size - reqsize;
        h2o_buffer_reserve(&sock->input, remaining_bytes);
        memcpy(sock->input->bytes, conn->_http1_req_input->bytes + reqsize, remaining_bytes);
        sock->input->size += remaining_bytes;
        on_read(conn->sock, NULL);
    }
}